

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O0

int wrterr(FILE *out,char *mess,int severity)

{
  int severity_local;
  char *mess_local;
  FILE *out_local;
  
  if (severity < err_report) {
    ffcmsg();
    out_local._4_4_ = 0;
  }
  else {
    nerrs = nerrs + 1;
    strcpy(temp,"*** Error:   ");
    strcat(temp,mess);
    if (out != (FILE *)0x0) {
      if ((out != _stdout) && ((FILE *)out != _stderr)) {
        print_fmt(out,temp,0xd);
      }
      print_fmt((FILE *)_stderr,temp,0xd);
    }
    if (200 < nerrs) {
      fprintf(_stderr,"??? Too many Errors! I give up...\n");
      close_report(out);
      exit(1);
    }
    ffcmsg();
    out_local._4_4_ = nerrs;
  }
  return out_local._4_4_;
}

Assistant:

int wrterr(FILE *out, char *mess, int severity )
{

    if(severity < err_report) { 
        fits_clear_errmsg();
        return 0; 
    }
    nerrs++;

    strcpy(temp,"*** Error:   ");
    strcat(temp,mess);
    if(out != NULL) {
         if ((out!=stdout) && (out!=stderr)) print_fmt(out,temp,13);
/*
   if ERR2OUT is defined, then error messages will be sent to the
   stdout stream rather than to stderr
*/
#ifdef ERR2OUT
         print_fmt(stdout,temp,13);
#else
         print_fmt(stderr,temp,13);
#endif
    }

    if(nerrs > MAXERRORS ) { 

#ifdef ERR2OUT
	 fprintf(stdout,"??? Too many Errors! I give up...\n");
#else
	 fprintf(stderr,"??? Too many Errors! I give up...\n");
#endif
         close_report(out);
         exit(1);
    }
    fits_clear_errmsg();
    return nerrs;
}